

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

int scv_clear(scv_vector *v)

{
  scv_vector *v_local;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x127,"int scv_clear(struct scv_vector *)");
  }
  if (v->data != (void *)0x0) {
    v->size = 0;
    return 0;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x128,
                "int scv_clear(struct scv_vector *)");
}

Assistant:

int scv_clear(struct scv_vector *v)
{
	assert(v != NULL);
	assert(v->data != NULL);

	v->size = 0;

	return SCV_OK;
}